

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

bool __thiscall
MT32Emu::Partial::doProduceOutput<float,MT32Emu::LA32FloatPartialPair>
          (Partial *this,float *leftBuf,float *rightBuf,Bit32u length,
          LA32FloatPartialPair *la32PairImpl)

{
  bool bVar1;
  LA32FloatPartialPair *la32PairImpl_local;
  float *pfStack_28;
  Bit32u length_local;
  float *rightBuf_local;
  float *leftBuf_local;
  Partial *this_local;
  
  pfStack_28 = rightBuf;
  rightBuf_local = leftBuf;
  leftBuf_local = (float *)this;
  bVar1 = canProduceOutput(this);
  if (bVar1) {
    this->alreadyOutputed = true;
    this->sampleNum = 0;
    while ((this->sampleNum < length &&
           (bVar1 = generateNextSample<MT32Emu::LA32FloatPartialPair>(this,la32PairImpl), bVar1))) {
      produceAndMixSample(this,&rightBuf_local,&stack0xffffffffffffffd8,la32PairImpl);
      this->sampleNum = this->sampleNum + 1;
    }
    this->sampleNum = 0;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Partial::doProduceOutput(Sample *leftBuf, Sample *rightBuf, Bit32u length, LA32PairImpl *la32PairImpl) {
	if (!canProduceOutput()) return false;
	alreadyOutputed = true;

	for (sampleNum = 0; sampleNum < length; sampleNum++) {
		if (!generateNextSample(la32PairImpl)) break;
		produceAndMixSample(leftBuf, rightBuf, la32PairImpl);
	}
	sampleNum = 0;
	return true;
}